

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall CLI::ValidationError::ValidationError(ValidationError *this,string *msg)

{
  allocator local_51;
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"ValidationError",&local_51);
  ::std::__cxx11::string::string((string *)&local_50,(string *)msg);
  ValidationError(this,&local_30,&local_50,ValidationError);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

ValidationError(std::string name, std::string msg) : ValidationError(name + ": " + msg) {}